

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_replaceAString_failure_nullptr_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined8 uStack_90;
  AString rep;
  AString old;
  
  old.reallocator._0_4_ = 0x11e238;
  old.reallocator._4_4_ = 0;
  old.deallocator._0_4_ = 0x11e278;
  old.deallocator._4_4_ = 0;
  old.buffer = (char *)0x0;
  old.size = 2;
  old.capacity = 2;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x1457f5;
  old.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,3);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  old.buffer[2] = '\0';
  old.buffer[0] = 'x';
  old.buffer[1] = 'y';
  rep.buffer = (char *)0x0;
  rep.reallocator._0_4_ = 0x11e238;
  rep.reallocator._4_4_ = 0;
  rep.deallocator._0_4_ = 0x11e278;
  rep.deallocator._4_4_ = 0;
  rep.size = 3;
  rep.capacity = 3;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x14584e;
  rep.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,4);
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(rep.buffer,"abc",4);
  private_ACUtilsTest_AString_reallocFail = 0;
  private_ACUtilsTest_AString_reallocCount = 0;
  uStack_90 = 0x14588a;
  bVar1 = AString_replaceAString((AString *)0x0,&old,&rep,0);
  if (bVar1 != false) {
    uStack_90 = 0x145a23;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x863,
                      "Assertion \'!AString_replaceAString(((void*)0), &old, &rep, 0)\' failed",0,0)
    ;
  }
  uStack_90 = 0x1458a3;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x863);
  if (old.capacity != 2) {
    local_a0 = "(2)";
    pcVar8 = "(old).capacity == (2)";
    pcVar4 = "(old).capacity";
    pcVar5 = (char *)old.capacity;
LAB_00145b0d:
    iVar2 = 0x864;
    local_98 = (char *)0x2;
LAB_00145c1e:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_a0;
    goto LAB_00145c20;
  }
  uStack_90 = 0x1458c3;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x864);
  if (old.buffer == (char *)0x0) {
    ppcVar7 = &local_98;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (old).buffer != NULL";
    pcVar9 = "(void*) (old).buffer";
    iVar2 = 0x864;
    goto LAB_00145c6b;
  }
  uStack_90 = 0x1458e0;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x864);
  pcVar9 = old.buffer;
  if (old.buffer == (char *)0x0) {
    pcVar5 = "";
    pcVar9 = "(null)";
LAB_00145aa1:
    local_a0 = "xy";
    pcStack_b0 = "(old).buffer == (\"xy\")";
    pcVar8 = "(old).buffer == (\"xy\")";
    pcVar4 = "(void*) (old).buffer";
    iVar2 = 0x864;
  }
  else {
    uStack_90 = 0x1458fd;
    iVar2 = strcmp("xy",old.buffer);
    if (iVar2 != 0) {
      pcVar5 = "\"";
      goto LAB_00145aa1;
    }
    uStack_90 = 0x145916;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x864);
    if (old.size != 2) {
      local_a0 = "strlen(\"xy\")";
      pcVar8 = "(old).size == strlen(\"xy\")";
      pcVar4 = "(old).size";
      pcVar5 = (char *)old.size;
      goto LAB_00145b0d;
    }
    uStack_90 = 0x145936;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x864);
    if (rep.capacity != 3) {
      local_a0 = "(3)";
      pcVar8 = "(rep).capacity == (3)";
      pcVar4 = "(rep).capacity";
      pcVar5 = (char *)rep.capacity;
LAB_00145c13:
      iVar2 = 0x865;
      local_98 = (char *)0x3;
      goto LAB_00145c1e;
    }
    uStack_90 = 0x145956;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x865);
    if (rep.buffer == (char *)0x0) {
      ppcVar7 = &local_98;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (rep).buffer != NULL";
      pcVar9 = "(void*) (rep).buffer";
      iVar2 = 0x865;
LAB_00145c6b:
      uStack_90 = 0;
      local_98 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) = test_AString_equals_valid_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_90 = 0x145973;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x865);
    pcVar9 = rep.buffer;
    if (rep.buffer == (char *)0x0) {
      pcVar9 = "(null)";
      pcVar5 = "";
    }
    else {
      uStack_90 = 0x145990;
      iVar2 = strcmp("abc",rep.buffer);
      if (iVar2 == 0) {
        uStack_90 = 0x1459a9;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x865);
        if (rep.size == 3) {
          uStack_90 = 0x1459c9;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x865);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_90 = 0x1459ea;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x866);
            uStack_90 = 0x1459f3;
            (*(code *)CONCAT44(old.deallocator._4_4_,old.deallocator._0_4_))(old.buffer);
            uStack_90 = 0x1459fc;
            (*(code *)CONCAT44(rep.deallocator._4_4_,rep.deallocator._0_4_))(rep.buffer);
            return;
          }
          ppcVar7 = &local_a8;
          local_a0 = "(0)";
          local_a8 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x866;
          goto LAB_00145c6b;
        }
        local_a0 = "strlen(\"abc\")";
        pcVar8 = "(rep).size == strlen(\"abc\")";
        pcVar4 = "(rep).size";
        pcVar5 = (char *)rep.size;
        goto LAB_00145c13;
      }
      pcVar5 = "\"";
    }
    local_a0 = "abc";
    pcStack_b0 = "(rep).buffer == (\"abc\")";
    pcVar8 = "(rep).buffer == (\"abc\")";
    pcVar4 = "(void*) (rep).buffer";
    iVar2 = 0x865;
  }
  pcStack_b0 = pcStack_b0 + 0x10;
  pcVar4 = pcVar4 + 8;
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_98 = "\"";
  local_a8 = "\"";
  ppcVar6 = &pcStack_c0;
  pcStack_c0 = pcVar9;
  pcStack_b8 = pcVar5;
LAB_00145c20:
  uStack_90 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar5;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x145c27;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar8,pcVar4);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceAString_failure_nullptr)
{
    struct AString old = private_ACUtilsTest_AString_constructTestString("xy", 2);
    struct AString rep = private_ACUtilsTest_AString_constructTestString("abc", 3);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    private_ACUtilsTest_AString_reallocCount = 0;
    ACUTILSTEST_ASSERT(!AString_replaceAString(nullptr, &old, &rep, 0));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(old, "xy", 2);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(rep, "abc", 3);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(old);
    private_ACUtilsTest_AString_destructTestString(rep);
}